

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.hpp
# Opt level: O3

void njoy::tools::disco::Integer<5u>::write<int,std::back_insert_iterator<std::__cxx11::string>>
               (int *value,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  ostringstream buffer;
  undefined1 auStack_1c8 [8];
  char local_1c0;
  undefined7 uStack_1bf;
  long local_1b8;
  long local_1b0 [2];
  long local_1a0 [2];
  undefined8 uStack_190;
  uint auStack_188 [22];
  ios_base local_130 [112];
  char acStack_c0 [152];
  
  uVar1 = *value;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  iVar4 = 1;
  if (9 < uVar3) {
    do {
      iVar4 = iVar4 + 1;
      bVar2 = 99 < uVar3;
      uVar3 = uVar3 / 10;
    } while (bVar2);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&uStack_190 + *(long *)(local_1a0[0] + -0x18)) = 5;
  if ((uint)(iVar4 - ((int)uVar1 >> 0x1f)) < 6) {
    std::ostream::operator<<(local_1a0,*value);
  }
  else {
    lVar5 = *(long *)(local_1a0[0] + -0x18);
    if (acStack_c0[lVar5 + 1] == '\0') {
      std::ios::widen((char)auStack_1c8 + (char)lVar5 + '(');
      acStack_c0[lVar5 + 1] = '\x01';
    }
    acStack_c0[lVar5] = '*';
    local_1c0 = '*';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1c0,1);
  }
  std::__cxx11::stringbuf::str();
  plVar6 = (long *)CONCAT71(uStack_1bf,local_1c0);
  if (local_1b8 != 0) {
    lVar5 = 0;
    do {
      std::__cxx11::string::push_back((char)iter->container);
      lVar5 = lVar5 + 1;
    } while (local_1b8 != lVar5);
    plVar6 = (long *)CONCAT71(uStack_1bf,local_1c0);
  }
  if (plVar6 != local_1b0) {
    operator_delete(plVar6,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

static void write( const Representation& value, Iterator& iter ) {

    // std::abs does not exist for all integer types (e.g. unsigned)
    const Representation absValue = value < 0 ? -value : value;
    const auto required = minimumRequiredWidth( absValue )
                        + ( value < 0 ? 1 : 0 );

    std::ostringstream buffer;
    buffer << std::right << std::setw( Width );
    if ( required > Width ) {

      buffer << std::setfill( '*' ) << '*';
    }
    else {

      buffer << value;
    }

    for ( auto b : buffer.str() ) {

      *iter++ = b;
    }
  }